

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

StorageClass __thiscall
spvtools::opt::ConvertToSampledImagePass::GetStorageClass
          (ConvertToSampledImagePass *this,Instruction *variable)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t id;
  int iVar1;
  StorageClass SVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  
  if (variable->opcode_ == OpVariable) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    this_01 = (this_00->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    id = 0;
    if (variable->has_type_id_ == true) {
      id = Instruction::GetSingleWordOperand(variable,0);
    }
    pTVar3 = analysis::TypeManager::GetType(this_01,id);
    iVar1 = (*pTVar3->_vptr_Type[0x1f])(pTVar3);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      SVar2 = Max;
    }
    else {
      SVar2 = *(StorageClass *)(CONCAT44(extraout_var,iVar1) + 0x30);
    }
    return SVar2;
  }
  __assert_fail("variable.opcode() == spv::Op::OpVariable",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                ,0x81,
                "spv::StorageClass spvtools::opt::ConvertToSampledImagePass::GetStorageClass(const Instruction &) const"
               );
}

Assistant:

spv::StorageClass ConvertToSampledImagePass::GetStorageClass(
    const Instruction& variable) const {
  assert(variable.opcode() == spv::Op::OpVariable);
  auto* type = context()->get_type_mgr()->GetType(variable.type_id());
  auto* pointer_type = type->AsPointer();
  if (!pointer_type) return spv::StorageClass::Max;

  return pointer_type->storage_class();
}